

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::Decode
          (Entity_Damage_Status_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  StandardVariable *pSVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  ushort uVar6;
  pointer pKVar7;
  KUINT32 datumID;
  KString local_60;
  uint local_3c;
  KUINT16 *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar3 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Decode","");
    KException::KException(this_00,&local_60,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vDdRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vDdRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar7 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar7->_vptr_KRef_Ptr)(pKVar7);
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar2);
    (this->m_vDdRec).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_DmgEnt).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_DmgEnt,stream);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
  local_38 = &this->m_ui16NumDmgDescRecs;
  KDataStream::Read<unsigned_short>(stream,local_38);
  if (this->m_ui16NumDmgDescRecs != 0) {
    uVar6 = 0;
    do {
      KVar3 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&local_3c);
      KDataStream::SetCurrentWritePosition(stream,KVar3);
      pSVar4 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
                         (local_3c,stream);
      if (pSVar4 == (StandardVariable *)0x0) {
        pSVar4 = (StandardVariable *)operator_new(0x10);
        DATA_TYPE::StandardVariable::StandardVariable(pSVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002229d8;
        local_60._M_string_length = (size_type)pSVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)&this->m_vDdRec,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_60);
      }
      else {
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002229d8;
        local_60._M_string_length = (size_type)pSVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)&this->m_vDdRec,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_60);
      }
      local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002229d8;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_60);
      uVar6 = uVar6 + 1;
    } while (uVar6 < *local_38);
  }
  return;
}

Assistant:

void Entity_Damage_Status_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ENTITY_DAMAGE_STATE_PDU )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vDdRec.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_DmgEnt
           >> m_ui32Padding
           >> m_ui16NumDmgDescRecs;

    for( KUINT16 i = 0; i < m_ui16NumDmgDescRecs; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        StandardVariable * p = StandardVariable::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vDdRec.push_back( StdVarPtr( p ) );
        }
        else
        {
            // Default
            m_vDdRec.push_back( StdVarPtr( new StandardVariable( stream ) ) );
        }
    }
}